

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

aiColor4D __thiscall
Assimp::MDLImporter::ReplaceTextureWithColor(MDLImporter *this,aiTexture *pcTexture)

{
  uint uVar1;
  uint uVar2;
  aiTexel *paVar3;
  aiColor4D aVar4;
  aiTexel *other;
  bool bVar5;
  aiTexel *pcTexelEnd;
  aiTexel *pcTexel;
  uint iNumPixels;
  aiTexture *pcTexture_local;
  MDLImporter *this_local;
  aiColor4D clrOut;
  
  if (pcTexture == (aiTexture *)0x0) {
    __assert_fail("__null != pcTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x67,"aiColor4D Assimp::MDLImporter::ReplaceTextureWithColor(const aiTexture *)")
    ;
  }
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)&this_local);
  this_local._0_4_ = get_qnan();
  if ((pcTexture->mHeight != 0) && (pcTexture->mWidth != 0)) {
    uVar1 = pcTexture->mHeight;
    uVar2 = pcTexture->mWidth;
    paVar3 = pcTexture->pcData;
    other = pcTexture->pcData;
    do {
      pcTexelEnd = other + 1;
      if (pcTexelEnd == paVar3 + uVar1 * uVar2) goto LAB_006acd34;
      bVar5 = aiTexel::operator!=(pcTexelEnd,other);
      other = pcTexelEnd;
    } while (!bVar5);
    pcTexelEnd = (aiTexel *)0x0;
LAB_006acd34:
    if (pcTexelEnd != (aiTexel *)0x0) {
      this_local._0_4_ = (float)pcTexture->pcData->r / 255.0;
      this_local._4_4_ = (float)pcTexture->pcData->g / 255.0;
      clrOut.r = (float)pcTexture->pcData->b / 255.0;
      clrOut.g = (float)pcTexture->pcData->a / 255.0;
    }
  }
  aVar4.g = this_local._4_4_;
  aVar4.r = this_local._0_4_;
  aVar4.b = clrOut.r;
  aVar4.a = clrOut.g;
  return aVar4;
}

Assistant:

aiColor4D MDLImporter::ReplaceTextureWithColor(const aiTexture* pcTexture)
{
    ai_assert(NULL != pcTexture);

    aiColor4D clrOut;
    clrOut.r = get_qnan();
    if (!pcTexture->mHeight || !pcTexture->mWidth)
        return clrOut;

    const unsigned int iNumPixels = pcTexture->mHeight*pcTexture->mWidth;
    const aiTexel* pcTexel = pcTexture->pcData+1;
    const aiTexel* const pcTexelEnd = &pcTexture->pcData[iNumPixels];

    while (pcTexel != pcTexelEnd)
    {
        if (*pcTexel != *(pcTexel-1))
        {
            pcTexel = NULL;
            break;
        }
        ++pcTexel;
    }
    if (pcTexel)
    {
        clrOut.r = pcTexture->pcData->r / 255.0f;
        clrOut.g = pcTexture->pcData->g / 255.0f;
        clrOut.b = pcTexture->pcData->b / 255.0f;
        clrOut.a = pcTexture->pcData->a / 255.0f;
    }
    return clrOut;
}